

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindowPrivate::setVisible(QMdiSubWindowPrivate *this,WindowStateAction action,bool visible)

{
  Data *pDVar1;
  QWidget *this_00;
  ControlContainer *this_01;
  Data *pDVar2;
  ControllerWidget *this_02;
  
  pDVar1 = this->actions[action].wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (this->actions[action].wp.value != (QObject *)0x0)) {
    QAction::setVisible(SUB81(this->actions[action].wp.value,0));
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pDVar1 = (this->controlContainer).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this->controlContainer).wp.value == (QObject *)0x0)) {
    this_01 = (ControlContainer *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(this_01,(QMdiSubWindow *)this_00);
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_01);
    pDVar1 = (this->controlContainer).wp.d;
    (this->controlContainer).wp.d = pDVar2;
    (this->controlContainer).wp.value = (QObject *)this_01;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
  }
  this_02 = (ControllerWidget *)
            QMetaObject::cast((QObject *)&QMdi::ControllerWidget::staticMetaObject);
  if (this_02 != (ControllerWidget *)0x0) {
    QMdi::ControllerWidget::setControlVisible(this_02,action,visible);
  }
  QWidget::update(this_00);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setVisible(WindowStateAction action, bool visible)
{
#ifndef QT_NO_ACTION
    if (actions[action])
        actions[action]->setVisible(visible);
#endif

    Q_Q(QMdiSubWindow);
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    if (ControllerWidget *ctrlWidget = qobject_cast<ControllerWidget *>
                                       (controlContainer->controllerWidget())) {
        ctrlWidget->setControlVisible(action, visible);
    }
    q->update();
}